

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::handle_peer_resp(raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  element_type *peVar6;
  context *pcVar7;
  string *psVar8;
  bool bVar9;
  msg_type mVar10;
  int iVar11;
  iterator iVar12;
  undefined8 uVar13;
  msg_type type;
  msg_type type_00;
  Type TVar14;
  element_type *peVar15;
  Param param;
  int32 peer_id;
  ptr<peer> pp;
  unique_lock<std::recursive_mutex> guard;
  string local_a0;
  Type local_7c;
  string local_78;
  ptr<peer> local_58;
  ptr<peer> local_48;
  unique_lock<std::recursive_mutex> local_38;
  
  local_38._M_device = &this->lock_;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  local_38._M_owns = true;
  peVar2 = (err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    peVar3 = (peVar2->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (peVar2->req_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      TVar14 = (peVar3->super_msg_base).dst_;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      TVar14 = (peVar3->super_msg_base).dst_;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_7c = TVar14;
    iVar12 = std::
             _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->peers_)._M_h,(key_type *)&local_7c);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
        _M_cur != (__node_type *)0x0) {
      local_78._M_dataplus._M_p =
           *(pointer *)
            ((long)iVar12.
                   super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                   ._M_cur + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar12.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x18));
    }
    if ((string *)local_78._M_dataplus._M_p == (string *)0x0) {
      iVar11 = 0;
    }
    else {
      LOCK();
      *(int *)(local_78._M_dataplus._M_p + 0x1cc) = *(int *)(local_78._M_dataplus._M_p + 0x1cc) + 1;
      UNLOCK();
      iVar11 = *(int *)(local_78._M_dataplus._M_p + 0x1cc);
      local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._M_dataplus._M_p;
      local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
        }
      }
      check_snapshot_timeout(this,&local_48);
      if (local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if (iVar11 < DAT_0023813c) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) &&
         (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), TVar14 = local_7c, 2 < iVar11)) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar13 = (**(code **)(*(long *)(err->
                                       super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 0x10))();
        msg_if_given_abi_cxx11_(&local_a0,"peer (%d) response error: %s",(ulong)TVar14,uVar13);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x31e,&local_a0);
LAB_001f3c28:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int32)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                      (int32)local_a0._M_dataplus._M_p));
        }
      }
    }
    else if (((iVar11 == DAT_0023813c) &&
             (peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar6 != (element_type *)0x0)) &&
            (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), 2 < iVar11)) {
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a0,"too verbose RPC error on peer (%d), will suppress it from now",
                 (ulong)local_7c);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x321,&local_a0);
      goto LAB_001f3c28;
    }
    if (((string *)local_78._M_dataplus._M_p != (string *)0x0) &&
       ((local_78._M_dataplus._M_p[0x1dc] & 1U) != 0)) {
      local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_78._M_dataplus._M_p;
      local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
        }
      }
      handle_join_leave_rpc_err(this,leave_cluster_request,&local_58);
      if (local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
    }
    goto LAB_001f3d28;
  }
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    if (peVar6 != (element_type *)0x0) {
      iVar11 = (**(code **)(*(long *)peVar6 + 0x38))();
      if (4 < iVar11) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  (&local_78,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type);
        peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_a0,
                   "Receive a %s message from peer %d with Result=%d, Term=%lu, NextIndex=%lu",
                   local_78._M_dataplus._M_p,(ulong)(uint)(peVar15->super_msg_base).src_,
                   (ulong)peVar15->accepted_,(peVar15->super_msg_base).term_,peVar15->next_idx_);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x337,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int32)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                      (int32)local_a0._M_dataplus._M_p));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) &&
         (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), 5 < iVar11)) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_a0,"src: %d, dst: %d, resp->get_term(): %d\n",
                   (ulong)(uint)(peVar15->super_msg_base).src_,
                   (ulong)(uint)(peVar15->super_msg_base).dst_,
                   (ulong)(uint)(peVar15->super_msg_base).term_);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x33a,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int32)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                      (int32)local_a0._M_dataplus._M_p));
        }
      }
    }
    peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar15->accepted_ == true) {
      local_a0._M_dataplus._M_p._0_4_ = (peVar15->super_msg_base).src_;
      iVar12 = std::
               _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->peers_)._M_h,(key_type *)&local_a0);
      if (iVar12.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
          _M_cur != (__node_type *)0x0) {
        lVar4 = *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                ._M_cur + 0x10);
        uVar1 = *(uint *)(lVar4 + 0x1cc);
        if (((DAT_0023813c <= (int)uVar1) &&
            (peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr, peVar6 != (element_type *)0x0)) &&
           (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), 2 < iVar11)) {
          peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a0,"recovered from RPC failure from peer %d, %d errors",
                     (ulong)(uint)(((resp->
                                    super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->super_msg_base).src_,(ulong)uVar1);
          (**(code **)(*(long *)peVar6 + 0x40))
                    (peVar6,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"handle_peer_resp",0x344,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int32)local_a0._M_dataplus._M_p) !=
              &local_a0.field_2) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                        (int32)local_a0._M_dataplus._M_p));
          }
        }
        LOCK();
        *(undefined4 *)(lVar4 + 0x1cc) = 0;
        UNLOCK();
        timer_helper::reset((timer_helper *)(lVar4 + 0x140));
      }
    }
    peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    mVar10 = (peVar15->super_msg_base).type_;
    if (mVar10 - request_vote_request < 0x17) {
      bVar9 = update_term(this,(peVar15->super_msg_base).term_);
      if (bVar9) goto LAB_001f3d28;
      peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      mVar10 = (peVar15->super_msg_base).type_;
    }
    if ((int)mVar10 < 0x11) {
      if (mVar10 == request_vote_response) {
        handle_vote_resp(this,peVar15);
        goto LAB_001f3d28;
      }
      if (mVar10 == append_entries_response) {
        local_a0._M_dataplus._M_p._0_4_ = this->id_;
        local_a0._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
        peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a0._M_string_length._0_4_ = (peVar15->super_msg_base).src_;
        pcVar7 = (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
        local_a0.field_2._M_allocated_capacity = (size_type)peVar15;
        if ((pcVar7->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
          local_7c = ReceivedAppendEntriesResp;
          local_78._M_dataplus._M_p = (pointer)&local_a0;
          (*(pcVar7->cb_func_).func._M_invoker)
                    ((_Any_data *)&pcVar7->cb_func_,&local_7c,(Param **)&local_78);
          peVar15 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        }
        handle_append_entries_resp(this,peVar15);
        goto LAB_001f3d28;
      }
      goto switchD_001f39fd_caseD_12;
    }
    switch(mVar10) {
    case install_snapshot_response:
      handle_install_snapshot_resp(this,peVar15);
      break;
    case ping_response:
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 == (element_type *)0x0) ||
         (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), iVar11 < 4)) break;
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_a0,"got ping response from %d",
                 (ulong)(uint)(((resp->
                                super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->super_msg_base).src_);
      (**(code **)(*(long *)peVar6 + 0x40))
                (peVar6,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_peer_resp",0x36e,&local_a0);
      goto LAB_001f3b07;
    case pre_vote_response:
      handle_prevote_resp(this,peVar15);
      break;
    case priority_change_response:
      handle_priority_change_resp(this,peVar15);
      break;
    default:
      if (mVar10 == custom_notification_response) {
        handle_custom_notification_resp(this,peVar15);
        break;
      }
    case ping_request:
    case pre_vote_request:
    case other_request:
    case other_response:
    case priority_change_request:
switchD_001f39fd_caseD_12:
      peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) &&
         (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), 1 < iVar11)) {
        peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_type_to_string_abi_cxx11_
                  (&local_78,
                   (nuraft *)
                   (ulong)(((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->super_msg_base).type_,type_00);
        msg_if_given_abi_cxx11_
                  (&local_a0,"received an unexpected response: %s, ignore it",
                   local_78._M_dataplus._M_p);
        (**(code **)(*(long *)peVar6 + 0x40))
                  (peVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_peer_resp",0x377,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int32)local_a0._M_dataplus._M_p) !=
            &local_a0.field_2) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                      (int32)local_a0._M_dataplus._M_p));
        }
        psVar8 = &local_78;
LAB_001f3b0c:
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&(psVar8->field_2)._M_allocated_capacity)[-2];
        if (paVar5 != &psVar8->field_2) {
          operator_delete(paVar5);
        }
      }
    }
LAB_001f3d28:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
    return;
  }
  if ((peVar6 == (element_type *)0x0) ||
     (iVar11 = (**(code **)(*(long *)peVar6 + 0x38))(), iVar11 < 3)) goto LAB_001f3d28;
  peVar6 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_(&local_a0,"empty peer response");
  (**(code **)(*(long *)peVar6 + 0x40))
            (peVar6,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
             ,"handle_peer_resp",0x32d,&local_a0);
LAB_001f3b07:
  psVar8 = &local_a0;
  goto LAB_001f3b0c;
}

Assistant:

void raft_server::handle_peer_resp(ptr<resp_msg>& resp, ptr<rpc_exception>& err) {
    recur_lock(lock_);
    if (err) {
        int32 peer_id = err->req()->get_dst();
        ptr<peer> pp = nullptr;
        auto entry = peers_.find(peer_id);
        if (entry != peers_.end()) pp = entry->second;

        int rpc_errs = 0;
        if (pp) {
            pp->inc_rpc_errs();
            rpc_errs = pp->get_rpc_errs();

            check_snapshot_timeout(pp);
        }

        if (rpc_errs < raft_server::raft_limits_.warning_limit_) {
            p_wn("peer (%d) response error: %s", peer_id, err->what());
        } else if (rpc_errs == raft_server::raft_limits_.warning_limit_) {
            p_wn("too verbose RPC error on peer (%d), "
                 "will suppress it from now", peer_id);
        }

        if (pp && pp->is_leave_flag_set()) {
            // If this is to-be-removed server, proceed it without
            // waiting for the response.
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, pp);
        }
        return;
    }

    if (!resp.get()) {
        p_wn("empty peer response");
        return;
    }

    p_db( "Receive a %s message from peer %d with "
          "Result=%d, Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
          msg_type_to_string(resp->get_type()).c_str(),
          resp->get_src(),
          resp->get_accepted() ? 1 : 0,
          resp->get_term(),
          resp->get_next_idx() );

    p_tr("src: %d, dst: %d, resp->get_term(): %d\n",
         (int)resp->get_src(), (int)resp->get_dst(), (int)resp->get_term());

    if (resp->get_accepted()) {
        // On accepted response, reset response timer.
        auto entry = peers_.find(resp->get_src());
        if (entry != peers_.end()) {
            peer* pp = entry->second.get();
            int rpc_errs = pp->get_rpc_errs();
            if (rpc_errs >= raft_server::raft_limits_.warning_limit_) {
                p_wn("recovered from RPC failure from peer %d, %d errors",
                     resp->get_src(), rpc_errs);
            }
            pp->reset_rpc_errs();
            pp->reset_resp_timer();
        }
    }

    if ( is_valid_msg(resp->get_type()) ) {
        bool update_term_succ = update_term(resp->get_term());

        // if term is updated, no more action is required
        if (update_term_succ) return;
    }

    // ignore the response that with lower term for safety
    switch (resp->get_type())
    {
    case msg_type::pre_vote_response:
        handle_prevote_resp(*resp);
        break;

    case msg_type::request_vote_response:
        handle_vote_resp(*resp);
        break;

    case msg_type::append_entries_response:
        {
            cb_func::Param param(id_, leader_, resp->get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesResp, &param);
        }
        handle_append_entries_resp(*resp);
        break;

    case msg_type::install_snapshot_response:
        handle_install_snapshot_resp(*resp);
        break;

    case msg_type::priority_change_response:
        handle_priority_change_resp(*resp);
        break;

    case msg_type::ping_response:
        p_in("got ping response from %d", resp->get_src());
        break;

    case msg_type::custom_notification_response:
        handle_custom_notification_resp(*resp);
        break;

    default:
        p_er( "received an unexpected response: %s, ignore it",
              msg_type_to_string(resp->get_type()).c_str() );
        break;
    }
}